

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall sjtu::invalid_command::~invalid_command(invalid_command *this)

{
  exception *in_RDI;
  
  in_RDI->_vptr_exception = (_func_int **)&PTR_what_abi_cxx11__00137880;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  exception::~exception(in_RDI);
  return;
}

Assistant:

invalid_command() {
	    wro = "invalid_command";
	}